

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O3

void __thiscall EventLoopThread::~EventLoopThread(EventLoopThread *this)

{
  this->exiting_ = true;
  if (this->loop_ != (EventLoop *)0x0) {
    EventLoop::quit(this->loop_);
    Thread::join(&this->thread_);
  }
  pthread_cond_destroy((pthread_cond_t *)&(this->cond_).cond);
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  pthread_mutex_destroy((pthread_mutex_t *)&this->mutex_);
  Thread::~Thread(&this->thread_);
  return;
}

Assistant:

EventLoopThread::~EventLoopThread(){
    exiting_ = true;
    if(loop_!=nullptr){
        loop_->quit();
        thread_.join();
    }
}